

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-vocab.cpp
# Opt level: O0

void __thiscall naive_trie::insert(naive_trie *this,char *key,size_t len,int32_t value)

{
  bool bVar1;
  iterator iVar2;
  undefined4 in_ECX;
  undefined1 uVar3;
  char *in_RDX;
  naive_trie *in_RSI;
  map<char,_naive_trie,_std::less<char>,_std::allocator<std::pair<const_char,_naive_trie>_>_>
  *in_RDI;
  __enable_if_t<is_constructible<value_type,_pair<char,_naive_trie>_>::value,_pair<iterator,_bool>_>
  _Var4;
  __enable_if_t<is_constructible<value_type,_pair<char,_naive_trie>_>::value,_pair<iterator,_bool>_>
  res_1;
  iterator res;
  char c;
  map<char,_naive_trie,_std::less<char>,_std::allocator<std::pair<const_char,_naive_trie>_>_>
  *in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  pair<char,_naive_trie> *in_stack_ffffffffffffff08;
  _Self local_30;
  int32_t value_00;
  undefined3 in_stack_ffffffffffffffe0;
  undefined4 uVar5;
  
  if (in_RDX == (char *)0x0) {
    *(undefined1 *)&in_RDI[1]._M_t._M_impl = 1;
    *(undefined4 *)&in_RDI[1]._M_t._M_impl.field_0x4 = in_ECX;
  }
  else {
    uVar5 = CONCAT13(*(undefined1 *)&(in_RSI->children)._M_t._M_impl,in_stack_ffffffffffffffe0);
    iVar2 = llama_vocab::std::
            map<char,_naive_trie,_std::less<char>,_std::allocator<std::pair<const_char,_naive_trie>_>_>
            ::find(in_stack_fffffffffffffef8,(key_type_conflict2 *)0x554d29);
    value_00 = (int32_t)((ulong)iVar2._M_node >> 0x20);
    local_30._M_node =
         (_Base_ptr)
         llama_vocab::std::
         map<char,_naive_trie,_std::less<char>,_std::allocator<std::pair<const_char,_naive_trie>_>_>
         ::end(in_stack_fffffffffffffef8);
    bVar1 = llama_vocab::std::operator!=((_Self *)&stack0xffffffffffffffd8,&local_30);
    if (bVar1) {
      llama_vocab::std::_Rb_tree_iterator<std::pair<const_char,_naive_trie>_>::operator->
                ((_Rb_tree_iterator<std::pair<const_char,_naive_trie>_> *)
                 CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
      insert(in_RSI,in_RDX,CONCAT44(in_ECX,uVar5),value_00);
    }
    else {
      naive_trie((naive_trie *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
      std::make_pair<char&,naive_trie>
                (&in_stack_ffffffffffffff08->first,
                 (naive_trie *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
      _Var4 = std::
              map<char,naive_trie,std::less<char>,std::allocator<std::pair<char_const,naive_trie>>>
              ::insert<std::pair<char,naive_trie>>(in_RDI,in_stack_ffffffffffffff08);
      uVar3 = _Var4.second;
      llama_vocab::std::pair<char,_naive_trie>::~pair((pair<char,_naive_trie> *)0x554e24);
      ~naive_trie((naive_trie *)0x554e2e);
      llama_vocab::std::_Rb_tree_iterator<std::pair<const_char,_naive_trie>_>::operator->
                ((_Rb_tree_iterator<std::pair<const_char,_naive_trie>_> *)
                 CONCAT17(uVar3,in_stack_ffffffffffffff00));
      insert(in_RSI,in_RDX,CONCAT44(in_ECX,uVar5),value_00);
    }
  }
  return;
}

Assistant:

void insert(const char * key, size_t len, int32_t value = 0) {
        if (len == 0) {
            this->has_value = true;
            this->value = value;
            return;
        }
        char c = key[0];
        auto res = children.find(c);
        if (res != children.end()) {
            res->second.insert(key + 1, len - 1, value);
        } else {
            auto res = children.insert(std::make_pair(c, naive_trie()));
            res.first->second.insert(key + 1, len - 1, value);
        }
    }